

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

StringBuilder * __thiscall Potassco::StringBuilder::appendFormat(StringBuilder *this,char *fmt,...)

{
  size_t sVar1;
  char in_AL;
  byte bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  undefined8 in_RCX;
  size_t sVar8;
  undefined8 in_RDX;
  size_t sVar9;
  ulong n;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t n_00;
  StringBuilder *str;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char small [64];
  undefined8 local_158;
  void **local_150;
  undefined1 *local_148;
  Buffer local_140;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  StringBuilder local_78;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  pcVar5 = strchr(fmt,0x25);
  if (pcVar5 == (char *)0x0) {
    n_00 = strlen(fmt);
  }
  else {
    n_00 = (long)pcVar5 - (long)fmt;
  }
  if (n_00 != 0) {
    append(this,fmt,n_00);
    fmt = fmt + n_00;
  }
  if (*fmt != '\0') {
    bVar2 = (this->field_0).sbo_[0x3f] & 0xc0;
    if (bVar2 == 0x40) {
      pcVar5 = (this->field_0).buf_.head;
      str = *(StringBuilder **)pcVar5;
      sVar6 = *(size_t *)(pcVar5 + 8);
      sVar8 = sVar6;
    }
    else if (bVar2 == 0x80) {
      sVar6 = (this->field_0).buf_.used;
      sVar8 = (this->field_0).buf_.size;
      str = (StringBuilder *)(this->field_0).buf_.head;
    }
    else {
      sVar6 = 0x3f - (ulong)(byte)(this->field_0).sbo_[0x3f];
      sVar8 = 0x3f;
      str = this;
    }
    sVar9 = 0;
    sVar1 = 0x40;
    if (sVar8 != sVar6) {
      sVar9 = sVar6;
      sVar1 = sVar8;
    }
    if (sVar8 == sVar6) {
      str = &local_78;
    }
    local_148 = local_128;
    local_150 = &args[0].overflow_arg_area;
    local_158 = 0x3000000010;
    uVar3 = ::vsnprintf((str->field_0).sbo_ + sVar9,sVar1 - sVar9,fmt,&local_158);
    if (0 < (int)uVar3) {
      n = (ulong)uVar3;
      if (n < sVar1 - sVar9) {
        if (str == &local_78) {
          append(this,(char *)str,n);
        }
        else {
          grow(&local_140,this,n);
        }
      }
      else {
        grow(&local_140,this,n);
        local_158 = 0x3000000010;
        local_150 = &args[0].overflow_arg_area;
        local_148 = local_128;
        iVar4 = ::vsnprintf(local_140.head + local_140.used,(local_140.size - local_140.used) + 1,
                            fmt,&local_158);
        if (local_140.size - local_140.used < (ulong)(long)iVar4) {
          piVar7 = __errno_location();
          *piVar7 = 0x22;
        }
      }
    }
  }
  return this;
}

Assistant:

StringBuilder& StringBuilder::appendFormat(const char* fmt, ...) {
	const char* p = std::strchr(fmt, '%');
	std::size_t x = p ? static_cast<std::size_t>(p - fmt) : std::strlen(fmt);
	if (x) { append(fmt, x); fmt += x; }
	if (*fmt) {
		char small[64];
		Buffer buf = buffer();
		if (buf.free() == 0) { buf.head = small; buf.used = 0; buf.size = sizeof(small); }
		va_list args;
		va_start(args, fmt);
		int n = vsnprintf(buf.pos(), buf.free(), fmt, args);
		va_end(args);
		if (n > 0 && (x = static_cast<size_t>(n)) < buf.free()) {
			if (buf.head == small) { append(buf.head, x); }
			else                   { grow(x); }
			return *this;
		}
		if (n > 0) {
			buf = grow(static_cast<size_t>(n));
			va_start(args, fmt);
			x = static_cast<size_t>(Potassco::vsnprintf(buf.pos(), buf.free() + 1, fmt, args));
			va_end(args);
			if (x > buf.free()) { errno = ERANGE; }
		}
	}
	return *this;
}